

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string_view google::protobuf::internal::ShortEditionName(Edition edition)

{
  string *this;
  string_view sVar1;
  string_view local_40;
  string_view local_30;
  Edition local_1c;
  Edition edition_local;
  
  local_1c = edition;
  this = Edition_Name<google::protobuf::Edition>(edition);
  local_30 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"EDITION_");
  sVar1 = absl::lts_20250127::StripPrefix(local_30,local_40);
  return sVar1;
}

Assistant:

absl::string_view ShortEditionName(Edition edition) {
  return absl::StripPrefix(Edition_Name(edition), "EDITION_");
}